

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall AdaptorSignature_Recover_Test::TestBody(AdaptorSignature_Recover_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  string local_68;
  string local_48;
  Privkey sec;
  
  cfd::core::AdaptorSignature::Recover(&sec,&adaptor_sig2,&compact_sig,&adaptor);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_48,&secret);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_68,&sec);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"secret.GetHex()","sec.GetHex()",&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x39,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sec);
  return;
}

Assistant:

TEST(AdaptorSignature, Recover) {
  auto sec = adaptor_sig2.Recover(compact_sig, adaptor);

  EXPECT_EQ(secret.GetHex(), sec.GetHex());
}